

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example3.cpp
# Opt level: O0

void __thiscall
SimpleDescriptor<Point3f>::compute
          (SimpleDescriptor<Point3f> *this,Point3f *query,
          vector<Point3f,_std::allocator<Point3f>_> *pts,
          Octree<Point3f,_std::vector<Point3f,_std::allocator<Point3f>_>_> *oct,
          vector<float,_std::allocator<float>_> *descriptor)

{
  vector<float,_std::allocator<float>_> *this_00;
  reference pvVar1;
  size_type sVar2;
  ulong uVar3;
  vector<float,_std::allocator<float>_> *in_RDI;
  vector<float,_std::allocator<float>_> *in_R8;
  float fVar4;
  uint32_t i;
  vector<float,_std::allocator<float>_> distances;
  vector<unsigned_int,_std::allocator<unsigned_int>_> neighbors;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int __c;
  Point3f *query_00;
  Octree<Point3f,_std::vector<Point3f,_std::allocator<Point3f>_>_> *this_01;
  uint local_68;
  undefined1 local_58 [24];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  vector<float,_std::allocator<float>_> *local_28;
  
  __c = 0;
  local_28 = in_R8;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in_R8,0);
  memset(pvVar1,__c,
         (ulong)*(uint *)((long)&(in_RDI->super__Vector_base<float,_std::allocator<float>_>)._M_impl
                                 .super__Vector_impl_data._M_start + 4));
  query_00 = (Point3f *)&local_40;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10f55d);
  this_01 = (Octree<Point3f,_std::vector<Point3f,_std::allocator<Point3f>_>_> *)local_58;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x10f56c);
  unibn::Octree<Point3f,std::vector<Point3f,std::allocator<Point3f>>>::
  radiusNeighbors<unibn::MaxDistance<Point3f>>
            (this_01,query_00,(float)((ulong)in_RDI >> 0x20),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(__c,in_stack_ffffffffffffff78),in_stack_ffffffffffffff70);
  local_68 = 0;
  while( true ) {
    uVar3 = (ulong)local_68;
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_40);
    this_00 = local_28;
    if (sVar2 <= uVar3) break;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_58,(ulong)local_68);
    fVar4 = (*pvVar1 /
            *(float *)&(in_RDI->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start) *
            (float)*(uint *)((long)&(in_RDI->super__Vector_base<float,_std::allocator<float>_>).
                                    _M_impl.super__Vector_impl_data._M_start + 4);
    uVar3 = (ulong)fVar4;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                       (this_00,uVar3 | (long)(fVar4 - 9.223372e+18) & (long)uVar3 >> 0x3f);
    *pvVar1 = *pvVar1 + 1.0;
    local_68 = local_68 + 1;
  }
  std::vector<float,_std::allocator<float>_>::~vector(in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI);
  return;
}

Assistant:

void compute(const PointT& query, const std::vector<PointT>& pts, const unibn::Octree<PointT>& oct,
               std::vector<float>& descriptor)
  {
    memset(&descriptor[0], 0, dim_);

    std::vector<uint32_t> neighbors;
    std::vector<float> distances;

    // template is needed to tell the compiler that radiusNeighbors is a method.
    oct.template radiusNeighbors<unibn::MaxDistance<PointT> >(query, radius_, neighbors, distances);
    for (uint32_t i = 0; i < neighbors.size(); ++i) descriptor[distances[i] / radius_ * dim_] += 1;
  }